

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall
ConnmanTestMsg::Handshake
          (ConnmanTestMsg *this,CNode *node,bool successfully_connected,ServiceFlags remote_services
          ,ServiceFlags local_services,int32_t version,bool relay_txs)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  __int_type _Var4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  NodeId NVar8;
  long in_RCX;
  byte in_DL;
  ParamsWrapper<CNetAddr::SerParams,_CService> *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  __pthread_list_t _Var9;
  ParamsWrapper<CNetAddr::SerParams,_CService> PVar10;
  byte in_stack_00000008;
  ConnmanTestMsg *connman;
  PeerManager *peerman;
  CNodeStateStats statestats;
  CSerializedNetMsg msg_verack;
  CSerializedNetMsg msg_version;
  CService *in_stack_fffffffffffffd08;
  CNode *this_00;
  CService *in_stack_fffffffffffffd10;
  CNode *node_00;
  SerParams *in_stack_fffffffffffffd18;
  ConnmanTestMsg *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  __atomic_base<int> *this_02;
  CNode *in_stack_fffffffffffffd30;
  CNode *pCVar11;
  ConnmanTestMsg *in_stack_fffffffffffffd38;
  __native_type *this_03;
  CSerializedNetMsg *in_stack_fffffffffffffd40;
  CNode *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  undefined4 in_stack_fffffffffffffd58;
  undefined2 in_stack_fffffffffffffd5c;
  undefined1 in_stack_fffffffffffffd5e;
  byte bVar12;
  undefined1 in_stack_fffffffffffffd5f;
  long *args_3;
  ParamsWrapper<CNetAddr::SerParams,_CService> *in_stack_fffffffffffffe00;
  unsigned_long *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  int *in_stack_fffffffffffffe18;
  bool *in_stack_fffffffffffffe20;
  byte local_1c8;
  long local_1a0;
  undefined4 local_184;
  undefined8 local_180;
  undefined1 local_178 [24];
  undefined1 local_160 [43];
  __native_type local_135 [2];
  long local_d0 [26];
  
  local_d0[0x19] = *(long *)(in_FS_OFFSET + 0x28);
  local_135[0]._0_1_ = in_stack_00000008 & 1;
  plVar1 = (long *)in_RDI[0x4d];
  local_135[0]._1_4_ = in_R9D;
  local_135[0]._5_8_ = in_RCX;
  (**(code **)*plVar1)(plVar1,in_RSI,in_R8);
  (**(code **)(*plVar1 + 0x20))(plVar1,in_RSI);
  FlushSendBuffer(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd5f,
                      CONCAT16(in_stack_fffffffffffffd5e,
                               CONCAT24(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58))),
             (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
             (allocator<char> *)in_stack_fffffffffffffd48);
  local_160._32_8_ =
       Using<CustomUintFormatter<8,false>,ServiceFlags&>((ServiceFlags *)in_stack_fffffffffffffd10);
  local_160._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_160._16_8_ = 0;
  CService::CService(in_stack_fffffffffffffd08);
  _Var9 = (__pthread_list_t)
          CNetAddr::SerParams::operator()(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  local_178._16_8_ = 0;
  local_160._0_16_ = (undefined1  [16])_Var9;
  CService::CService(in_stack_fffffffffffffd08);
  PVar10 = CNetAddr::SerParams::operator()(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  local_180 = 1;
  args_3 = local_d0;
  local_178._0_16_ = (undefined1  [16])PVar10;
  std::__cxx11::string::string(in_stack_fffffffffffffd20);
  local_184 = 0;
  this_03 = local_135;
  pCVar11 = (CNode *)&stack0xfffffffffffffe7c;
  this_02 = (__atomic_base<int> *)&local_180;
  this_01 = (ConnmanTestMsg *)local_178;
  node_00 = (CNode *)(local_178 + 0x10);
  this_00 = (CNode *)local_160;
  NetMsg::
  Make<int&,Wrapper<CustomUintFormatter<8,false>,ServiceFlags&>,long,long,ParamsWrapper<CNetAddr::SerParams,CService>,long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,std::__cxx11::string,int,bool&>
            ((string *)_Var9.__prev,(int *)_Var9.__next,
             (Wrapper<CustomUintFormatter<8,_false>,_ServiceFlags_&> *)PVar10.m_params,
             (long *)PVar10.m_object,args_3,in_RSI,in_RDI,in_stack_fffffffffffffe00,
             in_stack_fffffffffffffe08,in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  CService::~CService((CService *)this_00);
  CService::~CService((CService *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)(local_160 + 0x2a));
  ReceiveMsgFrom((ConnmanTestMsg *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  std::atomic<bool>::operator=((atomic<bool> *)this_00,false);
  ProcessMessagesOnce(this_01,node_00);
  (**(code **)(*plVar1 + 0x20))(plVar1,in_RSI);
  FlushSendBuffer((ConnmanTestMsg *)&this_03->__data,pCVar11);
  bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)this_02);
  if (!bVar2) {
    _Var4 = std::__atomic_base::operator_cast_to_int(this_02);
    if (_Var4 != local_135[0].__align._1_4_) {
      __assert_fail("node.nVersion == version",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                    ,0x37,
                    "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                   );
    }
    iVar5 = CNode::GetCommonVersion(this_00);
    piVar7 = std::min<int>((int *)node_00,(int *)this_00);
    if (iVar5 != *piVar7) {
      __assert_fail("node.GetCommonVersion() == std::min(version, PROTOCOL_VERSION)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                    ,0x38,
                    "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                   );
    }
    CNodeStateStats::CNodeStateStats((CNodeStateStats *)pCVar11);
    NVar8 = CNode::GetId(this_00);
    bVar3 = (**(code **)(plVar1[-1] + 0x70))(plVar1 + -1,NVar8,&stack0xfffffffffffffe08);
    if ((bVar3 & 1) == 0) {
      __assert_fail("peerman.GetNodeStateStats(node.GetId(), statestats)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                    ,0x3a,
                    "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                   );
    }
    uVar6 = (uint)(local_1c8 & 1);
    bVar12 = 0;
    if ((local_135[0].__size[0] & 1) != 0) {
      in_stack_fffffffffffffd57 = CNode::IsBlockOnlyConn(this_00);
      bVar12 = in_stack_fffffffffffffd57 ^ 0xff;
    }
    if (uVar6 != (bVar12 & 1)) {
      __assert_fail("statestats.m_relay_txs == (relay_txs && !node.IsBlockOnlyConn())",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                    ,0x3b,
                    "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                   );
    }
    if (local_1a0 != local_135[0]._5_8_) {
      __assert_fail("statestats.their_services == remote_services",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                    ,0x3c,
                    "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                   );
    }
    if ((in_DL & 1) != 0) {
      pCVar11 = (CNode *)&stack0xfffffffffffffe07;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar3,CONCAT16(bVar12,CONCAT24(in_stack_fffffffffffffd5c,uVar6))),
                 (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 (allocator<char> *)pCVar11);
      NetMsg::Make<>((string *)in_stack_fffffffffffffd40);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe07);
      ReceiveMsgFrom((ConnmanTestMsg *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50)
                     ,pCVar11,in_stack_fffffffffffffd40);
      std::atomic<bool>::operator=((atomic<bool> *)this_00,false);
      ProcessMessagesOnce(this_01,node_00);
      (**(code **)(*plVar1 + 0x20))(plVar1,in_RSI);
      bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)this_02);
      if (!bVar2) {
        __assert_fail("node.fSuccessfullyConnected == true",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                      ,0x43,
                      "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
                     );
      }
      CSerializedNetMsg::~CSerializedNetMsg((CSerializedNetMsg *)this_00);
    }
    CNodeStateStats::~CNodeStateStats((CNodeStateStats *)this_00);
  }
  CSerializedNetMsg::~CSerializedNetMsg((CSerializedNetMsg *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_d0[0x19]) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ConnmanTestMsg::Handshake(CNode& node,
                               bool successfully_connected,
                               ServiceFlags remote_services,
                               ServiceFlags local_services,
                               int32_t version,
                               bool relay_txs)
{
    auto& peerman{static_cast<PeerManager&>(*m_msgproc)};
    auto& connman{*this};

    peerman.InitializeNode(node, local_services);
    peerman.SendMessages(&node);
    FlushSendBuffer(node); // Drop the version message added by SendMessages.

    CSerializedNetMsg msg_version{
        NetMsg::Make(NetMsgType::VERSION,
                version,                                        //
                Using<CustomUintFormatter<8>>(remote_services), //
                int64_t{},                                      // dummy time
                int64_t{},                                      // ignored service bits
                CNetAddr::V1(CService{}),                       // dummy
                int64_t{},                                      // ignored service bits
                CNetAddr::V1(CService{}),                       // ignored
                uint64_t{1},                                    // dummy nonce
                std::string{},                                  // dummy subver
                int32_t{},                                      // dummy starting_height
                relay_txs),
    };

    (void)connman.ReceiveMsgFrom(node, std::move(msg_version));
    node.fPauseSend = false;
    connman.ProcessMessagesOnce(node);
    peerman.SendMessages(&node);
    FlushSendBuffer(node); // Drop the verack message added by SendMessages.
    if (node.fDisconnect) return;
    assert(node.nVersion == version);
    assert(node.GetCommonVersion() == std::min(version, PROTOCOL_VERSION));
    CNodeStateStats statestats;
    assert(peerman.GetNodeStateStats(node.GetId(), statestats));
    assert(statestats.m_relay_txs == (relay_txs && !node.IsBlockOnlyConn()));
    assert(statestats.their_services == remote_services);
    if (successfully_connected) {
        CSerializedNetMsg msg_verack{NetMsg::Make(NetMsgType::VERACK)};
        (void)connman.ReceiveMsgFrom(node, std::move(msg_verack));
        node.fPauseSend = false;
        connman.ProcessMessagesOnce(node);
        peerman.SendMessages(&node);
        assert(node.fSuccessfullyConnected == true);
    }
}